

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * FindWindowNavigable(int i_start,int i_stop,int dir)

{
  bool bVar1;
  value_type *ppIVar2;
  int i;
  ImVector<ImGuiWindow_*> *this;
  
  this = &GImGui->Windows;
  while( true ) {
    if (i_start < 0) {
      return (ImGuiWindow *)0x0;
    }
    if (i_stop == i_start) {
      return (ImGuiWindow *)0x0;
    }
    if (this->Size <= i_start) {
      return (ImGuiWindow *)0x0;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_start);
    bVar1 = ImGui::IsWindowNavFocusable(*ppIVar2);
    if (bVar1) break;
    i_start = i_start + dir;
  }
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i_start);
  return *ppIVar2;
}

Assistant:

static ImGuiWindow* FindWindowNavigable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.Windows.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.Windows[i]))
            return g.Windows[i];
    return NULL;
}